

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::
GenerateNewReflectiveBlockingServiceMethod(ImmutableServiceGenerator *this,Printer *printer)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  
  text._M_str = 
  "public static com.google.protobuf.BlockingService\n    newReflectiveBlockingService(final BlockingInterface impl) {\n  return new com.google.protobuf.BlockingService() {\n"
  ;
  text._M_len = 0xa8;
  io::Printer::Print<>(printer,text);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_00._M_str =
       "public final com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\n"
  ;
  text_00._M_len = 0x78;
  io::Printer::Print<>(printer,text_00);
  GenerateCallBlockingMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  io::Printer::Outdent(printer);
  text_01._M_str = "};\n";
  text_01._M_len = 3;
  io::Printer::Print<>(printer,text_01);
  io::Printer::Outdent(printer);
  text_02._M_str = "}\n\n";
  text_02._M_len = 3;
  io::Printer::Print<>(printer,text_02);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveBlockingServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.BlockingService\n"
      "    newReflectiveBlockingService(final BlockingInterface impl) {\n"
      "  return new com.google.protobuf.BlockingService() {\n");
  printer->Indent();
  printer->Indent();

  GenerateGetDescriptorForType(printer);

  GenerateCallBlockingMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}